

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

int * Extra_VectorSupportArray(DdManager *dd,DdNode **F,int n,int *support)

{
  int local_34;
  int local_2c;
  int size;
  int i;
  int *support_local;
  int n_local;
  DdNode **F_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_34 = dd->sizeZ;
  }
  else {
    local_34 = dd->size;
  }
  for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
    support[local_2c] = 0;
  }
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    ddSupportStep2((DdNode *)((ulong)F[local_2c] & 0xfffffffffffffffe),support);
  }
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    ddClearFlag2((DdNode *)((ulong)F[local_2c] & 0xfffffffffffffffe));
  }
  return support;
}

Assistant:

int *
Extra_VectorSupportArray( 
  DdManager * dd, /* manager */ 
  DdNode ** F, /* array of DDs whose support is sought */ 
  int n, /* size of the array */  
  int * support ) /* array allocated by the user */
{
    int i, size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax( dd->size, dd->sizeZ );
    for ( i = 0; i < size; i++ )
        support[i] = 0;

    /* Compute support and clean up markers. */
    for ( i = 0; i < n; i++ )
        ddSupportStep2( Cudd_Regular(F[i]), support );
    for ( i = 0; i < n; i++ )
        ddClearFlag2( Cudd_Regular(F[i]) );

    return support;
}